

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraSat.c
# Opt level: O0

int Fra_NodesAreClause(Fra_Man_t *p,Aig_Obj_t *pOld,Aig_Obj_t *pNew,int fComplL,int fComplR)

{
  int iVar1;
  int iVar2;
  sat_solver *psVar3;
  abctime aVar4;
  abctime aVar5;
  int status;
  abctime clk;
  int nBTLimit;
  int RetValue1;
  int RetValue;
  int pLits [4];
  int fComplR_local;
  int fComplL_local;
  Aig_Obj_t *pNew_local;
  Aig_Obj_t *pOld_local;
  Fra_Man_t *p_local;
  
  iVar1 = Aig_IsComplement(pNew);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pNew)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x144,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  iVar1 = Aig_IsComplement(pOld);
  if (iVar1 != 0) {
    __assert_fail("!Aig_IsComplement(pOld)",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x145,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  if (pNew == pOld) {
    __assert_fail("pNew != pOld",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                  ,0x146,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)");
  }
  iVar1 = p->pPars->nBTLimitNode;
  p->nSatCalls = p->nSatCalls + 1;
  if (p->pSat == (sat_solver *)0x0) {
    psVar3 = sat_solver_new();
    p->pSat = psVar3;
    p->nSatVars = 1;
    sat_solver_setnvars(p->pSat,1000);
    RetValue1 = toLit(0);
    sat_solver_addclause(p->pSat,&RetValue1,&RetValue);
  }
  Fra_CnfNodeAddToSolver(p,pOld,pNew);
  if (p->pSat->qtail != p->pSat->qhead) {
    iVar2 = sat_solver_simplify(p->pSat);
    if (iVar2 == 0) {
      __assert_fail("status != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x16a,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    if (p->pSat->qtail != p->pSat->qhead) {
      __assert_fail("p->pSat->qtail == p->pSat->qhead",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x16b,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
  }
  if (p->pPars->fConeBias != 0) {
    Fra_SetActivityFactors(p,pOld,pNew);
  }
  aVar4 = Abc_Clock();
  iVar2 = Fra_ObjSatNum(pOld);
  RetValue1 = toLitCond(iVar2,(uint)((fComplL != 0 ^ 0xffU) & 1));
  iVar2 = Fra_ObjSatNum(pNew);
  RetValue = toLitCond(iVar2,(uint)((fComplR != 0 ^ 0xffU) & 1));
  iVar1 = sat_solver_solve(p->pSat,&RetValue1,pLits,(long)iVar1,0,p->nBTLimitGlobal,
                           p->nInsLimitGlobal);
  aVar5 = Abc_Clock();
  p->timeSat = (aVar5 - aVar4) + p->timeSat;
  if (iVar1 == -1) {
    aVar5 = Abc_Clock();
    p->timeSatUnsat = (aVar5 - aVar4) + p->timeSatUnsat;
    RetValue1 = lit_neg(RetValue1);
    RetValue = lit_neg(RetValue);
    iVar1 = sat_solver_addclause(p->pSat,&RetValue1,pLits);
    if (iVar1 == 0) {
      __assert_fail("RetValue",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraSat.c"
                    ,0x184,"int Fra_NodesAreClause(Fra_Man_t *, Aig_Obj_t *, Aig_Obj_t *, int, int)"
                   );
    }
    p->nSatCallsUnsat = p->nSatCallsUnsat + 1;
    p->nSatProof = p->nSatProof + 1;
    p_local._4_4_ = 1;
  }
  else if (iVar1 == 1) {
    aVar5 = Abc_Clock();
    p->timeSatSat = (aVar5 - aVar4) + p->timeSatSat;
    Fra_SmlSavePattern(p);
    p->nSatCallsSat = p->nSatCallsSat + 1;
    p_local._4_4_ = 0;
  }
  else {
    aVar5 = Abc_Clock();
    p->timeSatFail = (aVar5 - aVar4) + p->timeSatFail;
    if (pOld != p->pManFraig->pConst1) {
      *(ulong *)&pOld->field_0x18 = *(ulong *)&pOld->field_0x18 & 0xffffffffffffffdf | 0x20;
    }
    *(ulong *)&pNew->field_0x18 = *(ulong *)&pNew->field_0x18 & 0xffffffffffffffdf | 0x20;
    p->nSatFailsReal = p->nSatFailsReal + 1;
    p_local._4_4_ = -1;
  }
  return p_local._4_4_;
}

Assistant:

int Fra_NodesAreClause( Fra_Man_t * p, Aig_Obj_t * pOld, Aig_Obj_t * pNew, int fComplL, int fComplR )
{
    int pLits[4], RetValue, RetValue1, nBTLimit;
    abctime clk;//, clk2 = Abc_Clock();
    int status;

    // make sure the nodes are not complemented
    assert( !Aig_IsComplement(pNew) );
    assert( !Aig_IsComplement(pOld) );
    assert( pNew != pOld );

    // if at least one of the nodes is a failed node, perform adjustments:
    // if the backtrack limit is small, simply skip this node
    // if the backtrack limit is > 10, take the quare root of the limit
    nBTLimit = p->pPars->nBTLimitNode;
/*
    if ( !p->pPars->fSpeculate && p->pPars->nFramesK == 0 && (nBTLimit > 0 && (pOld->fMarkB || pNew->fMarkB)) )
    {
        p->nSatFails++;
        // fail immediately
//        return -1;
        if ( nBTLimit <= 10 )
            return -1;
        nBTLimit = (int)pow(nBTLimit, 0.7);
    }
*/
    p->nSatCalls++;

    // make sure the solver is allocated and has enough variables
    if ( p->pSat == NULL )
    {
        p->pSat = sat_solver_new();
        p->nSatVars = 1;
        sat_solver_setnvars( p->pSat, 1000 );
        // var 0 is reserved for const1 node - add the clause
        pLits[0] = toLit( 0 );
        sat_solver_addclause( p->pSat, pLits, pLits + 1 );
    }

    // if the nodes do not have SAT variables, allocate them
    Fra_CnfNodeAddToSolver( p, pOld, pNew );

    if ( p->pSat->qtail != p->pSat->qhead )
    {
        status = sat_solver_simplify(p->pSat);
        assert( status != 0 );
        assert( p->pSat->qtail == p->pSat->qhead );
    }

    // prepare variable activity
    if ( p->pPars->fConeBias )
        Fra_SetActivityFactors( p, pOld, pNew ); 

    // solve under assumptions
    // A = 1; B = 0     OR     A = 1; B = 1 
clk = Abc_Clock();
//    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), 0 );
//    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), pOld->fPhase == pNew->fPhase );
    pLits[0] = toLitCond( Fra_ObjSatNum(pOld), !fComplL );
    pLits[1] = toLitCond( Fra_ObjSatNum(pNew), !fComplR );
//Sat_SolverWriteDimacs( p->pSat, "temp.cnf", pLits, pLits + 2, 1 );
    RetValue1 = sat_solver_solve( p->pSat, pLits, pLits + 2, 
        (ABC_INT64_T)nBTLimit, (ABC_INT64_T)0, 
        p->nBTLimitGlobal, p->nInsLimitGlobal );
p->timeSat += Abc_Clock() - clk;
    if ( RetValue1 == l_False )
    {
p->timeSatUnsat += Abc_Clock() - clk;
        pLits[0] = lit_neg( pLits[0] );
        pLits[1] = lit_neg( pLits[1] );
        RetValue = sat_solver_addclause( p->pSat, pLits, pLits + 2 );
        assert( RetValue );
        // continue solving the other implication
        p->nSatCallsUnsat++;
    }
    else if ( RetValue1 == l_True )
    {
p->timeSatSat += Abc_Clock() - clk;
        Fra_SmlSavePattern( p );
        p->nSatCallsSat++;
        return 0;
    }
    else // if ( RetValue1 == l_Undef )
    {
p->timeSatFail += Abc_Clock() - clk;
        // mark the node as the failed node
        if ( pOld != p->pManFraig->pConst1 ) 
            pOld->fMarkB = 1;
        pNew->fMarkB = 1;
        p->nSatFailsReal++;
        return -1;
    }
    // return SAT proof
    p->nSatProof++;
    return 1;
}